

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

D_Parser * new_D_Parser(D_ParserTables *t,int sizeof_ParseNode_User)

{
  D_Parser *__s;
  code *pcVar1;
  
  __s = (D_Parser *)malloc(0x1b8);
  memset(__s,0,0x1b8);
  __s[1].initial_scope = (D_Scope *)t;
  (__s->loc).line = 1;
  __s->sizeof_user_parse_node = sizeof_ParseNode_User;
  __s->commit_actions_interval = 100;
  __s->error_recovery = 1;
  __s->syntax_error_fn = syntax_error_report_fn;
  __s->ambiguity_fn = ambiguity_abort_fn;
  __s->save_parse_tree = t->save_parse_tree;
  pcVar1 = t->default_white_space;
  if (pcVar1 == (D_WhiteSpaceFn)0x0) {
    if (t->whitespace_state == 0) {
      pcVar1 = white_space;
    }
    else {
      pcVar1 = parse_whitespace;
    }
  }
  __s->initial_white_space_fn = pcVar1;
  return __s;
}

Assistant:

D_Parser *new_D_Parser(D_ParserTables *t, int sizeof_ParseNode_User) {
  Parser *p = MALLOC(sizeof(Parser));
  memset(p, 0, sizeof(Parser));
  p->t = t;
  p->user.loc.line = 1;
  p->user.sizeof_user_parse_node = sizeof_ParseNode_User;
  p->user.commit_actions_interval = DEFAULT_COMMIT_ACTIONS_INTERVAL;
  p->user.syntax_error_fn = syntax_error_report_fn;
  p->user.ambiguity_fn = ambiguity_abort_fn;
  p->user.error_recovery = 1;
  p->user.save_parse_tree = t->save_parse_tree;
  if (p->t->default_white_space)
    p->user.initial_white_space_fn = p->t->default_white_space;
  else if (p->t->whitespace_state)
    p->user.initial_white_space_fn = parse_whitespace;
  else
    p->user.initial_white_space_fn = white_space;
  return (D_Parser *)p;
}